

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O3

void nuts_scratch_addr_zero(char *scheme,size_t sz,char *addr)

{
  byte bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  undefined4 extraout_var;
  
  iVar2 = strcmp(scheme,"inproc");
  if ((iVar2 == 0) || (iVar2 = strcmp(scheme,"abstract"), iVar2 == 0)) {
    uVar5 = nng_random();
    uVar6 = nng_random();
    uVar3 = nng_random();
    uVar4 = nng_random();
    snprintf(addr,sz,"%s://nuts%04x%04x%04x%04x",scheme,uVar5,(ulong)uVar6,(ulong)uVar3,(ulong)uVar4
            );
    return;
  }
  bVar1 = *scheme;
  if (bVar1 < 0x75) {
    if (bVar1 != 0x69) {
      if ((bVar1 == 0x74) &&
         (((scheme[1] == 'c' && (scheme[2] == 'p')) || ((scheme[1] == 'l' && (scheme[2] == 's'))))))
      {
LAB_0012e0b0:
        pcVar10 = strchr(scheme,0x36);
        pcVar11 = "[::1]";
        if (pcVar10 == (char *)0x0) {
          pcVar11 = "127.0.0.1";
        }
        snprintf(addr,sz,"%s://%s:%u",scheme,pcVar11,0);
        return;
      }
      goto LAB_0012e0fa;
    }
    if ((scheme[1] != 'p') || (scheme[2] != 'c')) goto LAB_0012e0fa;
  }
  else {
    if (bVar1 == 0x75) {
      if ((scheme[1] == 'd') && (scheme[2] == 'p')) goto LAB_0012e0b0;
    }
    else if ((bVar1 == 0x77) && (scheme[1] == 's')) {
      pcVar11 = strchr(scheme,0x36);
      pcVar10 = "[::1]";
      if (pcVar11 == (char *)0x0) {
        pcVar10 = "127.0.0.1";
      }
      uVar5 = nng_random();
      uVar9 = CONCAT44(extraout_var,uVar5);
      uVar7 = nng_random();
      uVar8 = nng_random();
      nng_random();
      pcVar11 = "%s://%s:%u/nuts%04x%04x%04x%04x";
      uVar12 = 0;
      goto LAB_0012e187;
    }
LAB_0012e0fa:
    iVar2 = strncmp(scheme,"unix",4);
    if (iVar2 != 0) {
      nng_log_err("NUTS","Unknown scheme");
      abort();
    }
  }
  pcVar10 = getenv("TMPDIR");
  if ((pcVar10 == (char *)0x0) && (pcVar10 = getenv("TEMP"), pcVar10 == (char *)0x0)) {
    pcVar11 = getenv("TMP");
    pcVar10 = "/tmp";
    if (pcVar11 != (char *)0x0) {
      pcVar10 = pcVar11;
    }
  }
  uVar5 = nng_random();
  uVar6 = nng_random();
  uVar9 = (ulong)uVar6;
  uVar7 = nng_random();
  uVar8 = nng_random();
  pcVar11 = "%s://%s/nuts%04x%04x%04x%04x";
  uVar12 = (ulong)uVar5;
LAB_0012e187:
  snprintf(addr,sz,pcVar11,scheme,pcVar10,uVar12,uVar9,(ulong)uVar7,(ulong)uVar8);
  return;
}

Assistant:

void
nuts_scratch_addr_zero(const char *scheme, size_t sz, char *addr)
{
	if ((strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "abstract") == 0)) {
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "tcp", 3) == 0) ||
	    (strncmp(scheme, "tls", 3) == 0) ||
	    (strncmp(scheme, "udp", 3) == 0)) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u", scheme, ip, 0);
		return;
	}

	if (strncmp(scheme, "ws", 2) == 0) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u/nuts%04x%04x%04x%04x",
		    scheme, ip, 0, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
	}

	if ((strncmp(scheme, "ipc", 3) == 0) ||
	    (strncmp(scheme, "unix", 4) == 0)) {
#ifdef _WIN32
		// Windows doesn't place IPC names in the filesystem.
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
#else
		char *tmpdir;

		if (((tmpdir = getenv("TMPDIR")) == NULL) &&
		    ((tmpdir = getenv("TEMP")) == NULL) &&
		    ((tmpdir = getenv("TMP")) == NULL)) {
			tmpdir = "/tmp";
		}

		(void) snprintf(addr, sz, "%s://%s/nuts%04x%04x%04x%04x",
		    scheme, tmpdir, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
#endif
	}

	// We should not be here.
	nng_log_err("NUTS", "Unknown scheme");
	abort();
}